

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingManager.cpp
# Opt level: O0

void __thiscall SLogLib::LoggingManagerPriv::~LoggingManagerPriv(LoggingManagerPriv *this)

{
  bool bVar1;
  reference ppAVar2;
  AbstractLoggingDevice *_device;
  iterator __end2;
  iterator __begin2;
  list<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
  *__range2;
  lock_guard<std::mutex> _lock;
  LoggingManagerPriv *this_local;
  
  _lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range2,&this->mLoggingDevicesMutex);
  __end2 = std::__cxx11::
           list<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
           ::begin(&this->mLoggingDevices);
  _device = (AbstractLoggingDevice *)
            std::__cxx11::
            list<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
            ::end(&this->mLoggingDevices);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&_device);
    if (!bVar1) break;
    ppAVar2 = std::_List_iterator<SLogLib::AbstractLoggingDevice_*>::operator*(&__end2);
    if (*ppAVar2 != (AbstractLoggingDevice *)0x0) {
      (*(*ppAVar2)->_vptr_AbstractLoggingDevice[1])();
    }
    std::_List_iterator<SLogLib::AbstractLoggingDevice_*>::operator++(&__end2);
  }
  std::atomic<bool>::operator=((atomic<bool> *)&gLoggingManagerDestructed,true);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  std::__cxx11::
  list<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>::~list
            (&this->mLoggingDevices);
  return;
}

Assistant:

~LoggingManagerPriv()
	{
		// Destructor should be called by the main thread, just before program dies.
		std::lock_guard<std::mutex> _lock(mLoggingDevicesMutex);
		for(AbstractLoggingDevice* _device : mLoggingDevices)
		{
			delete _device;
		}
		
		gLoggingManagerDestructed = true;
	}